

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::LoopLayerParams::ByteSizeLong(LoopLayerParams *this)

{
  size_type sVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  
  sVar1 = ((this->conditionvar_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar7 = 0;
  }
  else {
    uVar6 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar7 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->conditionnetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    sVar4 = NeuralNetwork::ByteSizeLong(this->conditionnetwork_);
    uVar6 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar7 = sVar7 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->bodynetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    sVar4 = NeuralNetwork::ByteSizeLong(this->bodynetwork_);
    uVar6 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar7 = sVar7 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->maxloopiterations_ != 0) {
    uVar5 = this->maxloopiterations_ | 1;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar7 = sVar7 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t LoopLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LoopLayerParams)
  size_t total_size = 0;

  // string conditionVar = 2;
  if (this->conditionvar().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->conditionvar());
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->has_conditionnetwork()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->conditionnetwork_);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->has_bodynetwork()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bodynetwork_);
  }

  // uint64 maxLoopIterations = 1;
  if (this->maxloopiterations() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->maxloopiterations());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}